

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

Test * ParserTestUTF8::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestUTF8((ParserTestUTF8 *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, UTF8) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule utf8\n"
"  command = true\n"
"  description = compilaci\xC3\xB3\n"));
}